

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

int __thiscall cmCPackIFWGenerator::PackageFiles(cmCPackIFWGenerator *this)

{
  cmCPackLog *this_00;
  int iVar1;
  ostream *this_01;
  char *msg;
  string *psVar2;
  undefined1 local_230 [8];
  string ifwTmpFile;
  string local_208;
  cmValue local_1e8;
  undefined1 local_1e0 [8];
  string ifwTLD;
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackIFWGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_01 = std::operator<<((ostream *)local_190,"- Configuration");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
    this_00 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x1f,msg);
    std::__cxx11::string::~string((string *)(ifwTLD.field_2._M_local_buf + 8));
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  cmCPackIFWInstaller::GenerateInstallerFile(&this->Installer);
  cmCPackIFWInstaller::GeneratePackageFiles(&this->Installer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"CPACK_TOPLEVEL_DIRECTORY",
             (allocator<char> *)(ifwTmpFile.field_2._M_local_buf + 0xf));
  local_1e8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_208);
  psVar2 = cmValue::operator_cast_to_string_(&local_1e8);
  std::__cxx11::string::string((string *)local_1e0,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)(ifwTmpFile.field_2._M_local_buf + 0xf));
  cmStrCat<std::__cxx11::string&,char_const(&)[15]>
            ((string *)local_230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
             (char (*) [15])"/IFWOutput.log");
  iVar1 = RunRepogen(this,(string *)local_230);
  if (iVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = RunBinaryCreator(this,(string *)local_230);
    if (iVar1 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string((string *)local_1e0);
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWGenerator::PackageFiles()
{
  cmCPackIFWLogger(OUTPUT, "- Configuration" << std::endl);

  // Installer configuragion
  this->Installer.GenerateInstallerFile();

  // Packages configuration
  this->Installer.GeneratePackageFiles();

  std::string ifwTLD = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string ifwTmpFile = cmStrCat(ifwTLD, "/IFWOutput.log");

  // Create repositories
  if (!this->RunRepogen(ifwTmpFile)) {
    return 0;
  }

  // Create installer
  if (!this->RunBinaryCreator(ifwTmpFile)) {
    return 0;
  }

  return 1;
}